

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

InplaceStr GetTypeDefaultConstructorName(ExpressionContext *ctx,TypeClass *classType)

{
  int iVar1;
  TypeClass *pTVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ulong size;
  uint uVar4;
  InplaceStr IVar5;
  InplaceStr IVar6;
  
  pTVar2 = (TypeClass *)classType->proto;
  if ((TypeClass *)classType->proto == (TypeClass *)0x0) {
    pTVar2 = classType;
  }
  IVar5 = GetTypeConstructorName((pTVar2->super_TypeStruct).super_TypeBase.name);
  uVar4 = (int)IVar5.end - (int)IVar5.begin;
  size = (ulong)(uVar4 + 2);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,size);
  IVar6.begin = (char *)CONCAT44(extraout_var,iVar1);
  NULLC::SafeSprintf(IVar6.begin,size,"%.*s$",(ulong)uVar4,IVar5.begin);
  sVar3 = strlen(IVar6.begin);
  IVar6.end = IVar6.begin + sVar3;
  return IVar6;
}

Assistant:

InplaceStr GetTypeDefaultConstructorName(ExpressionContext &ctx, TypeClass *classType)
{
	InplaceStr baseName(GetTypeConstructorName(classType));

	unsigned length = baseName.length() + 2;
	char *name = (char*)ctx.allocator->alloc(length);
	NULLC::SafeSprintf(name, length, "%.*s$", FMT_ISTR(baseName));

	return InplaceStr(name);
}